

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorUtil.h
# Opt level: O1

void jaegertracing::utils::ErrorUtil::logError(Logger *logger,string *message)

{
  undefined8 uVar1;
  long *plVar2;
  ostream *poVar3;
  char *pcVar4;
  size_t sVar5;
  int iVar6;
  undefined1 auVar7 [12];
  ostringstream oss;
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  undefined1 local_198 [376];
  
  auVar7 = __cxa_rethrow();
  iVar6 = auVar7._8_4_;
  uVar1 = auVar7._0_8_;
  if (iVar6 == 4) {
    plVar2 = (long *)__cxa_begin_catch(uVar1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(message->_M_dataplus)._M_p,message->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
    pcVar4 = (char *)(**(code **)(*plVar2 + 0x10))(plVar2);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)poVar3->_vptr_basic_ostream[-3]);
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", numFailed=",0xc);
    std::ostream::operator<<(poVar3,(int)plVar2[2]);
    std::__cxx11::stringbuf::str();
    (*logger->_vptr_Logger[2])(logger,local_1b8);
  }
  else if (iVar6 == 3) {
    plVar2 = (long *)__cxa_begin_catch(uVar1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(message->_M_dataplus)._M_p,message->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
    pcVar4 = (char *)(**(code **)(*plVar2 + 0x10))(plVar2);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)poVar3->_vptr_basic_ostream[-3]);
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", code=",7);
    std::ostream::operator<<(poVar3,(int)plVar2[2]);
    std::__cxx11::stringbuf::str();
    (*logger->_vptr_Logger[2])(logger,local_1b8);
  }
  else {
    plVar2 = (long *)__cxa_begin_catch(uVar1);
    if (iVar6 != 2) {
      (*logger->_vptr_Logger[2])(logger,message);
      goto LAB_001c2a63;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(message->_M_dataplus)._M_p,message->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
    pcVar4 = (char *)(**(code **)(*plVar2 + 0x10))(plVar2);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)poVar3->_vptr_basic_ostream[-3]);
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
    }
    std::__cxx11::stringbuf::str();
    (*logger->_vptr_Logger[2])(logger,local_1b8);
  }
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0]);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
LAB_001c2a63:
  __cxa_end_catch();
  return;
}

Assistant:

inline void logError(logging::Logger& logger, const std::string& message)
{
    try {
        throw;
    } catch (const Sender::Exception& ex) {
        std::ostringstream oss;
        oss << message << ": " << ex.what() << ", numFailed=" << ex.numFailed();
        logger.error(oss.str());
    } catch (const std::system_error& ex) {
        std::ostringstream oss;
        oss << message << ": " << ex.what() << ", code=" << ex.code().value();
        logger.error(oss.str());
    } catch (const std::exception& ex) {
        std::ostringstream oss;
        oss << message << ": " << ex.what();
        logger.error(oss.str());
    } catch (...) {
        logger.error(message);
    }
}